

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepairResponsePdu.cpp
# Opt level: O0

bool __thiscall DIS::RepairResponsePdu::operator==(RepairResponsePdu *this,RepairResponsePdu *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  RepairResponsePdu *rhs_local;
  RepairResponsePdu *this_local;
  
  local_19 = LogisticsFamilyPdu::operator==
                       (&this->super_LogisticsFamilyPdu,&rhs->super_LogisticsFamilyPdu);
  bVar1 = EntityID::operator==(&this->_receivingEntityID,&rhs->_receivingEntityID);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = EntityID::operator==(&this->_repairingEntityID,&rhs->_repairingEntityID);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_repairResult != rhs->_repairResult) {
    local_19 = false;
  }
  if (this->_padding1 != rhs->_padding1) {
    local_19 = false;
  }
  if (this->_padding2 != rhs->_padding2) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool RepairResponsePdu::operator ==(const RepairResponsePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = LogisticsFamilyPdu::operator==(rhs);

     if( ! (_receivingEntityID == rhs._receivingEntityID) ) ivarsEqual = false;
     if( ! (_repairingEntityID == rhs._repairingEntityID) ) ivarsEqual = false;
     if( ! (_repairResult == rhs._repairResult) ) ivarsEqual = false;
     if( ! (_padding1 == rhs._padding1) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;

    return ivarsEqual;
 }